

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol,int start,int incr)

{
  undefined8 *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  DataKey DVar8;
  long lVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  uint *puVar13;
  uint *puVar14;
  devexpr *pdVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  ulong uVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_2f4;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  undefined8 local_240;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar18 = 0;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_240._0_4_ = cpp_dec_float_finite;
  local_240._4_4_ = 0x1c;
  local_2b8._0_16_ = (undefined1  [16])0x0;
  local_2b8._16_16_ = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  uStack_24b = 0;
  iStack_248 = 0;
  bStack_244 = false;
  local_2f4 = -1;
  iVar6 = (int)((ulong)((long)(pSVar2->coWeights).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar4) >> 7);
  if (start < iVar6) {
    lVar10 = (long)start;
    uVar17 = lVar10 << 7 | 0x78;
    local_2f4 = -1;
    do {
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + uVar17);
      puVar14 = (uint *)(puVar1 + -0xf);
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar12->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
      }
      iStack_248 = *(int *)(puVar1 + -1);
      bStack_244 = *(bool *)((long)puVar1 + -4);
      local_240 = *puVar1;
      pnVar11 = feastol;
      pcVar12 = &local_230;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
      }
      local_230.exp = (feastol->m_backend).exp;
      local_230.neg = (feastol->m_backend).neg;
      local_230.fpclass = (feastol->m_backend).fpclass;
      local_230.prec_elem = (feastol->m_backend).prec_elem;
      if (local_230.data._M_elems[0] != 0 || local_230.fpclass != cpp_dec_float_finite) {
        local_230.neg = (bool)(local_230.neg ^ 1);
      }
      if ((local_230.fpclass != cpp_dec_float_NaN && (fpclass_type)local_240 != cpp_dec_float_NaN)
         && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_2b8,&local_230), iVar7 < 0))
      {
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
        pdVar15 = local_b0;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *(uint *)pdVar15 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
          pdVar15 = pdVar15 + (ulong)bVar18 * -8 + 4;
        }
        local_40 = iStack_248;
        local_3c = bStack_244;
        local_38 = (fpclass_type)local_240;
        iStack_34 = local_240._4_4_;
        puVar14 = (uint *)((long)&(pnVar4->m_backend).data + (uVar17 - 0x78));
        puVar13 = puVar14;
        pnVar11 = &local_130;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = *puVar13;
          puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = puVar14[0x1c];
        local_130.m_backend.neg = SUB41(puVar14[0x1d],0);
        local_130.m_backend.fpclass = puVar14[0x1e];
        local_130.m_backend.prec_elem = puVar14[0x1f];
        pnVar11 = feastol;
        pnVar16 = &local_1b0;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_230,local_b0,&local_130,&local_1b0,&local_130);
        pcVar12 = &local_230;
        puVar13 = (uint *)local_2b8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar13 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
          puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
        }
        iStack_248 = local_230.exp;
        bStack_244 = local_230.neg;
        local_240._0_4_ = local_230.fpclass;
        local_240._4_4_ = local_230.prec_elem;
        if (((local_230.fpclass != cpp_dec_float_NaN) &&
            ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_2b8,&best->m_backend),
           0 < iVar7)) {
          puVar13 = (uint *)local_2b8;
          pnVar11 = best;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar11->m_backend).data._M_elems[0] = *puVar13;
            puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
          }
          (best->m_backend).exp = iStack_248;
          (best->m_backend).neg = bStack_244;
          (best->m_backend).fpclass = (fpclass_type)local_240;
          (best->m_backend).prec_elem = local_240._4_4_;
          pnVar11 = &this->last;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar11->m_backend).data._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + (ulong)bVar18 * -8 + 4);
          }
          (this->last).m_backend.exp = *(int *)((long)&(pnVar4->m_backend).data + (uVar17 - 8));
          (this->last).m_backend.neg = *(bool *)((long)&(pnVar4->m_backend).data + (uVar17 - 4));
          uVar5 = *(undefined8 *)((long)&(pnVar4->m_backend).data + uVar17);
          (this->last).m_backend.fpclass = (int)uVar5;
          (this->last).m_backend.prec_elem = (int)((ulong)uVar5 >> 0x20);
          local_2f4 = (int)lVar10;
        }
      }
      lVar10 = lVar10 + incr;
      uVar17 = uVar17 + (long)incr * 0x80;
    } while (lVar10 < iVar6);
  }
  if (local_2f4 < 0) {
    DVar8.info = 0;
    DVar8.idx = -1;
  }
  else {
    DVar8 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,local_2f4);
  }
  return (SPxId)DVar8;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseDim(R& best, R feastol, int start, int incr)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   int end = this->thesolver->coWeights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->coTest().dim());

   for(; start < end; start += incr)
   {
      x = cTest[start];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = cpen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);

   return SPxId();
}